

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon.c
# Opt level: O0

void unstuck(monst *mtmp)

{
  monst *mtmp_local;
  
  if (u.ustuck == mtmp) {
    if ((u._1052_1_ & 1) != 0) {
      u.ux = mtmp->mx;
      u.uy = mtmp->my;
      u._1052_1_ = u._1052_1_ & 0xfe;
      u.uswldtim = 0;
      if (uball != (obj *)0x0) {
        placebc();
      }
      vision_full_recalc = '\x01';
      doredraw();
    }
    u.ustuck = (monst *)0x0;
    u._1052_1_ = u._1052_1_ & 0x7f;
  }
  return;
}

Assistant:

void unstuck(struct monst *mtmp)
{
	if (u.ustuck == mtmp) {
		if (u.uswallow){
			u.ux = mtmp->mx;
			u.uy = mtmp->my;
			u.uswallow = 0;
			u.uswldtim = 0;
			if (Punished) placebc();
			vision_full_recalc = 1;
			doredraw();
		}
		u.ustuck = 0;
		u.uwilldrown = 0;
	}
}